

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  ImVec2 IVar1;
  undefined8 *puVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  uint flags_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ImGuiWindow *pIVar11;
  char *text_end;
  ImGuiPayload *pIVar12;
  ImGuiPayload *pIVar13;
  char *text;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_228;
  float local_218;
  bool local_211;
  int local_1ec;
  float local_1cc;
  float local_1c8;
  float local_1a8;
  bool local_1a1;
  float local_1a0;
  int local_19c;
  float local_190;
  float local_18c;
  float local_17c;
  ImGuiPayload *payload_1;
  ImGuiPayload *payload;
  int local_160;
  bool accepted_drag_drop;
  ImVec2 IStack_15c;
  int n_1;
  uint local_154;
  undefined4 local_150;
  ImGuiColorEditFlags picker_flags;
  ImGuiColorEditFlags picker_flags_to_forward;
  ImVec2 local_144;
  ImVec2 local_13c;
  ImVec2 local_134;
  ImVec2 local_12c;
  undefined1 auStack_124 [8];
  ImVec4 col_v4;
  ImGuiWindow *pIStack_108;
  float button_offset_x;
  ImGuiWindow *picker_active_window;
  char *p;
  char buf [64];
  bool disable_hue_edit;
  int n;
  int fmt_idx;
  bool hide_prefix;
  float w_item_last;
  float w_item_one;
  float inputs_offset_x;
  ImVec2 pos;
  bool value_changed_as_float;
  float fStack_84;
  bool value_changed;
  int i [4];
  float f [4];
  int components;
  bool hdr;
  bool alpha;
  ImGuiColorEditFlags flags_untouched;
  char *label_display_end;
  float w_inputs;
  float w_button;
  float w_full;
  float square_sz;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  char *label_local;
  
  pIVar11 = GetCurrentWindow();
  pIVar4 = GImGui;
  if ((pIVar11->SkipItems & 1U) == 0) {
    fVar15 = GetFrameHeight();
    fVar16 = CalcItemWidth();
    if ((flags & 0x10U) == 0) {
      local_17c = fVar15 + (pIVar4->Style).ItemInnerSpacing.x;
    }
    else {
      local_17c = 0.0;
    }
    local_218 = fVar16 - local_17c;
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    ImGuiNextItemData::ClearFlags(&pIVar4->NextItemData);
    BeginGroup();
    PushID(label);
    window._4_4_ = flags;
    if ((flags & 0x20U) != 0) {
      window._4_4_ = flags & 0xff8fffffU | 0x100008;
    }
    if ((window._4_4_ & 8) == 0) {
      ColorEditOptionsPopup(col,window._4_4_);
    }
    if ((window._4_4_ & 0x700000) == 0) {
      window._4_4_ = pIVar4->ColorEditOptions & 0x700000U | window._4_4_;
    }
    if ((window._4_4_ & 0x1800000) == 0) {
      window._4_4_ = pIVar4->ColorEditOptions & 0x1800000U | window._4_4_;
    }
    if ((window._4_4_ & 0x6000000) == 0) {
      window._4_4_ = pIVar4->ColorEditOptions & 0x6000000U | window._4_4_;
    }
    if ((window._4_4_ & 0x18000000) == 0) {
      window._4_4_ = pIVar4->ColorEditOptions & 0x18000000U | window._4_4_;
    }
    flags_00 = pIVar4->ColorEditOptions & 0xe00fffffU | window._4_4_;
    bVar5 = ImIsPowerOfTwo(window._4_4_ & 0x700000);
    if (!bVar5) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x105c,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    bVar5 = ImIsPowerOfTwo(window._4_4_ & 0x18000000);
    if (!bVar5) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x105d,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    bVar5 = (flags_00 & 2) == 0;
    bVar14 = (flags_00 & 0x80000) != 0;
    f[3] = 4.2039e-45;
    if (bVar5) {
      f[3] = 5.60519e-45;
    }
    i[2] = (int)*col;
    i[3] = (int)col[1];
    f[0] = col[2];
    if (bVar5) {
      local_18c = col[3];
    }
    else {
      local_18c = 1.0;
    }
    f[1] = local_18c;
    if (((window._4_4_ & 0x10000000) == 0) || ((window._4_4_ & 0x100000) == 0)) {
      if (((window._4_4_ & 0x8000000) != 0) && ((window._4_4_ & 0x200000) != 0)) {
        ColorConvertRGBtoHSV((float)i[2],(float)i[3],f[0],(float *)(i + 2),(float *)(i + 3),f);
      }
    }
    else {
      ColorConvertHSVtoRGB((float)i[2],(float)i[3],f[0],(float *)(i + 2),(float *)(i + 3),f);
    }
    pos.y = (float)(int)((float)i[2] * 255.0 +
                        (float)(~-(uint)(0.0 <= (float)i[2]) & 0xbf000000 |
                               -(uint)(0.0 <= (float)i[2]) & 0x3f000000));
    fStack_84 = (float)(int)((float)i[3] * 255.0 +
                            (float)(~-(uint)(0.0 <= (float)i[3]) & 0xbf000000 |
                                   -(uint)(0.0 <= (float)i[3]) & 0x3f000000));
    i[0] = (int)(f[0] * 255.0 +
                (float)(~-(uint)(0.0 <= f[0]) & 0xbf000000 | -(uint)(0.0 <= f[0]) & 0x3f000000));
    i[1] = (int)(f[1] * 255.0 +
                (float)(~-(uint)(0.0 <= f[1]) & 0xbf000000 | -(uint)(0.0 <= f[1]) & 0x3f000000));
    pos.x._3_1_ = 0;
    pos.x._2_1_ = 0;
    IVar1 = (pIVar11->DC).CursorPos;
    if ((pIVar4->Style).ColorButtonPosition == 0) {
      local_190 = local_17c;
    }
    else {
      local_190 = 0.0;
    }
    w_item_one = IVar1.x;
    (pIVar11->DC).CursorPos.x = w_item_one + local_190;
    if (((window._4_4_ & 0x300000) == 0) || ((flags_00 & 0x20) != 0)) {
      if (((window._4_4_ & 0x400000) != 0) && ((flags_00 & 0x20) == 0)) {
        if (bVar5) {
          uVar7 = ImClamp<int>((int)pos.y,0,0xff);
          uVar8 = ImClamp<int>((int)fStack_84,0,0xff);
          uVar9 = ImClamp<int>(i[0],0,0xff);
          iVar10 = ImClamp<int>(i[1],0,0xff);
          ImFormatString((char *)&p,0x40,"#%02X%02X%02X%02X",(ulong)uVar7,(ulong)uVar8,(ulong)uVar9,
                         iVar10);
        }
        else {
          uVar7 = ImClamp<int>((int)pos.y,0,0xff);
          uVar8 = ImClamp<int>((int)fStack_84,0,0xff);
          uVar9 = ImClamp<int>(i[0],0,0xff);
          ImFormatString((char *)&p,0x40,"#%02X%02X%02X",(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
        }
        SetNextItemWidth(local_218);
        bVar14 = InputText("##Text",(char *)&p,0x40,6,(ImGuiInputTextCallback)0x0,(void *)0x0);
        if (bVar14) {
          pos.x._3_1_ = 1;
          picker_active_window = (ImGuiWindow *)&p;
          while( true ) {
            local_211 = true;
            if (*(char *)&picker_active_window->Name != '#') {
              local_211 = ImCharIsBlankA(*(char *)&picker_active_window->Name);
            }
            if (local_211 == false) break;
            picker_active_window = (ImGuiWindow *)((long)&picker_active_window->Name + 1);
          }
          i[1] = 0;
          i[0] = 0;
          fStack_84 = 0.0;
          pos.y = 0.0;
          if (bVar5) {
            __isoc99_sscanf(picker_active_window,"%02X%02X%02X%02X",&pos.y,&stack0xffffffffffffff7c,
                            i,i + 1);
          }
          else {
            __isoc99_sscanf(picker_active_window,"%02X%02X%02X",&pos.y,&stack0xffffffffffffff7c,i);
          }
        }
        if ((flags_00 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
      }
    }
    else {
      fVar17 = ImMax<float>(1.0,(float)(int)((local_218 -
                                             (pIVar4->Style).ItemInnerSpacing.x *
                                             (float)((int)f[3] + -1)) / (float)(int)f[3]));
      fVar18 = ImMax<float>(1.0,(float)(int)(local_218 -
                                            (fVar17 + (pIVar4->Style).ItemInnerSpacing.x) *
                                            (float)((int)f[3] + -1)));
      text = "M:000";
      if ((window._4_4_ & 0x1000000) != 0) {
        text = "M:0.000";
      }
      IVar3 = CalcTextSize(text,(char *)0x0,false,-1.0);
      n = (int)IVar3.x;
      if ((float)n < fVar17) {
        local_19c = 1;
        if ((window._4_4_ & 0x200000) != 0) {
          local_19c = 2;
        }
      }
      else {
        local_19c = 0;
      }
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      for (; (int)buf._60_4_ < (int)f[3]; buf._60_4_ = buf._60_4_ + 1) {
        if (0 < (int)buf._60_4_) {
          SameLine(0.0,(pIVar4->Style).ItemInnerSpacing.x);
        }
        local_1a0 = fVar18;
        if (buf._60_4_ + 1 < (int)f[3]) {
          local_1a0 = fVar17;
        }
        SetNextItemWidth(local_1a0);
        local_1a1 = false;
        if ((buf._60_4_ == 0) && (local_1a1 = false, (window._4_4_ & 0x200000) != 0)) {
          local_1a1 = fStack_84 == 0.0;
        }
        buf[0x3b] = local_1a1;
        if ((window._4_4_ & 0x1000000) == 0) {
          iVar10 = 0;
          if (local_1a1 == false) {
            local_1ec = 0xff;
            if (bVar14) {
              local_1ec = 0;
            }
          }
          else {
            iVar10 = 0x7fffffff;
            local_1ec = -0x80000000;
          }
          bVar6 = DragInt(ColorEdit4::ids[(int)buf._60_4_],(int *)(&pos.y + (int)buf._60_4_),1.0,
                          iVar10,local_1ec,ColorEdit4::fmt_table_int[local_19c][(int)buf._60_4_]);
          pos.x._3_1_ = (pos.x._3_1_ & 1) != 0 || bVar6;
        }
        else {
          local_1a8 = 3.4028235e+38;
          if (local_1a1 == false) {
            local_1a8 = 0.0;
            local_1cc = 0.0;
            if (!bVar14) {
              local_1cc = 1.0;
            }
            local_1c8 = local_1cc;
          }
          else {
            local_1c8 = -3.4028235e+38;
          }
          bVar6 = DragFloat(ColorEdit4::ids[(int)buf._60_4_],
                            (float *)(i + (long)(int)buf._60_4_ + 2),0.003921569,local_1a8,local_1c8
                            ,ColorEdit4::fmt_table_float[local_19c][(int)buf._60_4_],1.0);
          pos.x._3_1_ = (pos.x._3_1_ & 1) != 0 || bVar6;
          pos.x._2_1_ = (pos.x._2_1_ & 1) != 0 || (bool)pos.x._3_1_;
        }
        if ((flags_00 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
      }
    }
    pIStack_108 = (ImGuiWindow *)0x0;
    inputs_offset_x = IVar1.y;
    if ((flags_00 & 0x10) == 0) {
      if (((flags_00 & 0x20) == 0) && ((pIVar4->Style).ColorButtonPosition != 0)) {
        local_218 = local_218 + (pIVar4->Style).ItemInnerSpacing.x;
      }
      else {
        local_218 = 0.0;
      }
      ImVec2::ImVec2((ImVec2 *)&col_v4.z,w_item_one + local_218,inputs_offset_x);
      (pIVar11->DC).CursorPos.x = col_v4.z;
      (pIVar11->DC).CursorPos.y = col_v4.w;
      if (bVar5) {
        local_228 = col[3];
      }
      else {
        local_228 = 1.0;
      }
      ImVec4::ImVec4((ImVec4 *)auStack_124,*col,col[1],col[2],local_228);
      ImVec2::ImVec2(&local_12c,0.0,0.0);
      bVar14 = ColorButton("##ColorButton",(ImVec4 *)auStack_124,flags_00,local_12c);
      if ((bVar14) && ((flags_00 & 4) == 0)) {
        (pIVar4->ColorPickerRef).x = (float)auStack_124._0_4_;
        (pIVar4->ColorPickerRef).y = (float)auStack_124._4_4_;
        (pIVar4->ColorPickerRef).z = col_v4.x;
        (pIVar4->ColorPickerRef).w = col_v4.y;
        OpenPopup("picker");
        local_13c = ImRect::GetBL(&(pIVar11->DC).LastItemRect);
        ImVec2::ImVec2(&local_144,-1.0,(pIVar4->Style).ItemSpacing.y);
        local_134 = ::operator+(&local_13c,&local_144);
        ImVec2::ImVec2((ImVec2 *)&picker_flags,0.0,0.0);
        SetNextWindowPos(&local_134,0,(ImVec2 *)&picker_flags);
      }
      if ((flags_00 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      bVar14 = BeginPopup("picker",0);
      if (bVar14) {
        pIStack_108 = pIVar4->CurrentWindow;
        if (label != text_end) {
          TextEx(label,text_end,0);
          Spacing();
        }
        local_150 = 0x1f890002;
        local_154 = flags & 0x1f890002U | 0x740080;
        SetNextItemWidth(fVar15 * 12.0);
        bVar14 = ColorPicker4("##picker",col,local_154,&(pIVar4->ColorPickerRef).x);
        pos.x._3_1_ = (pos.x._3_1_ & 1) != 0 || bVar14;
        EndPopup();
      }
    }
    if ((label != text_end) && ((flags_00 & 0x80) == 0)) {
      ImVec2::ImVec2(&stack0xfffffffffffffea4,
                     w_item_one + fVar16 + (pIVar4->Style).ItemInnerSpacing.x,
                     inputs_offset_x + (pIVar4->Style).FramePadding.y);
      (pIVar11->DC).CursorPos = IStack_15c;
      TextEx(label,text_end,0);
    }
    if (((pos.x._3_1_ & 1) != 0) && (pIStack_108 == (ImGuiWindow *)0x0)) {
      if ((pos.x._2_1_ & 1) == 0) {
        for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
          i[(long)local_160 + 2] = (int)((float)(int)(&pos.y)[local_160] / 255.0);
        }
      }
      if (((window._4_4_ & 0x200000) != 0) && ((window._4_4_ & 0x8000000) != 0)) {
        ColorConvertHSVtoRGB((float)i[2],(float)i[3],f[0],(float *)(i + 2),(float *)(i + 3),f);
      }
      if (((window._4_4_ & 0x100000) != 0) && ((window._4_4_ & 0x10000000) != 0)) {
        ColorConvertRGBtoHSV((float)i[2],(float)i[3],f[0],(float *)(i + 2),(float *)(i + 3),f);
      }
      *col = (float)i[2];
      col[1] = (float)i[3];
      col[2] = f[0];
      if (bVar5) {
        col[3] = f[1];
      }
    }
    PopID();
    EndGroup();
    if (((((pIVar11->DC).LastItemStatusFlags & 1U) != 0) && ((flags_00 & 0x200) == 0)) &&
       (bVar5 = BeginDragDropTarget(), bVar5)) {
      pIVar12 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar12 != (ImGuiPayload *)0x0) {
        puVar2 = (undefined8 *)pIVar12->Data;
        *(undefined8 *)col = *puVar2;
        col[2] = *(float *)(puVar2 + 1);
        pos.x._3_1_ = 1;
      }
      pIVar13 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar13 != (ImGuiPayload *)0x0) {
        memcpy(col,pIVar13->Data,(long)(int)f[3] << 2);
        pos.x._3_1_ = 1;
      }
      payload._7_1_ = pIVar13 != (ImGuiPayload *)0x0 || pIVar12 != (ImGuiPayload *)0x0;
      if ((payload._7_1_) && ((window._4_4_ & 0x10000000) != 0)) {
        ColorConvertRGBtoHSV(*col,col[1],col[2],col,col + 1,col + 2);
      }
      EndDragDropTarget();
    }
    if (((pIStack_108 != (ImGuiWindow *)0x0) && (pIVar4->ActiveId != 0)) &&
       (pIVar4->ActiveIdWindow == pIStack_108)) {
      (pIVar11->DC).LastItemId = pIVar4->ActiveId;
    }
    if ((pos.x._3_1_ & 1) != 0) {
      MarkItemEdited((pIVar11->DC).LastItemId);
    }
    label_local._7_1_ = (bool)(pos.x._3_1_ & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::ColorEdit4(const char* label, float col[4], ImGuiColorEditFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float square_sz = GetFrameHeight();
    const float w_full = CalcItemWidth();
    const float w_button = (flags & ImGuiColorEditFlags_NoSmallPreview) ? 0.0f : (square_sz + style.ItemInnerSpacing.x);
    const float w_inputs = w_full - w_button;
    const char* label_display_end = FindRenderedTextEnd(label);
    g.NextItemData.ClearFlags();

    BeginGroup();
    PushID(label);

    // If we're not showing any slider there's no point in doing any HSV conversions
    const ImGuiColorEditFlags flags_untouched = flags;
    if (flags & ImGuiColorEditFlags_NoInputs)
        flags = (flags & (~ImGuiColorEditFlags__DisplayMask)) | ImGuiColorEditFlags_DisplayRGB | ImGuiColorEditFlags_NoOptions;

    // Context menu: display and modify options (before defaults are applied)
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorEditOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__DisplayMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__DisplayMask);
    if (!(flags & ImGuiColorEditFlags__DataTypeMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__DataTypeMask);
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__PickerMask);
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags__InputMask);
    flags |= (g.ColorEditOptions & ~(ImGuiColorEditFlags__DisplayMask | ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__PickerMask | ImGuiColorEditFlags__InputMask));
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));   // Check that only 1 is selected

    const bool alpha = (flags & ImGuiColorEditFlags_NoAlpha) == 0;
    const bool hdr = (flags & ImGuiColorEditFlags_HDR) != 0;
    const int components = alpha ? 4 : 3;

    // Convert to the formats we need
    float f[4] = { col[0], col[1], col[2], alpha ? col[3] : 1.0f };
    if ((flags & ImGuiColorEditFlags_InputHSV) && (flags & ImGuiColorEditFlags_DisplayRGB))
        ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
    else if ((flags & ImGuiColorEditFlags_InputRGB) && (flags & ImGuiColorEditFlags_DisplayHSV))
        ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);
    int i[4] = { IM_F32_TO_INT8_UNBOUND(f[0]), IM_F32_TO_INT8_UNBOUND(f[1]), IM_F32_TO_INT8_UNBOUND(f[2]), IM_F32_TO_INT8_UNBOUND(f[3]) };

    bool value_changed = false;
    bool value_changed_as_float = false;

    const ImVec2 pos = window->DC.CursorPos;
    const float inputs_offset_x = (style.ColorButtonPosition == ImGuiDir_Left) ? w_button : 0.0f;
    window->DC.CursorPos.x = pos.x + inputs_offset_x;

    if ((flags & (ImGuiColorEditFlags_DisplayRGB | ImGuiColorEditFlags_DisplayHSV)) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB/HSV 0..255 Sliders
        const float w_item_one  = ImMax(1.0f, (float)(int)((w_inputs - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
        const float w_item_last = ImMax(1.0f, (float)(int)(w_inputs - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));

        const bool hide_prefix = (w_item_one <= CalcTextSize((flags & ImGuiColorEditFlags_Float) ? "M:0.000" : "M:000").x);
        static const char* ids[4] = { "##X", "##Y", "##Z", "##W" };
        static const char* fmt_table_int[3][4] =
        {
            {   "%3d",   "%3d",   "%3d",   "%3d" }, // Short display
            { "R:%3d", "G:%3d", "B:%3d", "A:%3d" }, // Long display for RGBA
            { "H:%3d", "S:%3d", "V:%3d", "A:%3d" }  // Long display for HSVA
        };
        static const char* fmt_table_float[3][4] =
        {
            {   "%0.3f",   "%0.3f",   "%0.3f",   "%0.3f" }, // Short display
            { "R:%0.3f", "G:%0.3f", "B:%0.3f", "A:%0.3f" }, // Long display for RGBA
            { "H:%0.3f", "S:%0.3f", "V:%0.3f", "A:%0.3f" }  // Long display for HSVA
        };
        const int fmt_idx = hide_prefix ? 0 : (flags & ImGuiColorEditFlags_DisplayHSV) ? 2 : 1;

        for (int n = 0; n < components; n++)
        {
            if (n > 0)
                SameLine(0, style.ItemInnerSpacing.x);
            SetNextItemWidth((n + 1 < components) ? w_item_one : w_item_last);

            // Disable Hue edit when Saturation is zero
            const bool disable_hue_edit = (n == 0 && (flags & ImGuiColorEditFlags_DisplayHSV) && i[1] == 0);
            if (flags & ImGuiColorEditFlags_Float)
            {
                value_changed |= DragFloat(ids[n], &f[n], 1.0f/255.0f, disable_hue_edit ? +FLT_MAX : 0.0f, disable_hue_edit ? -FLT_MAX : hdr ? 0.0f : 1.0f, fmt_table_float[fmt_idx][n]);
                value_changed_as_float |= value_changed;
            }
            else
            {
                value_changed |= DragInt(ids[n], &i[n], 1.0f, disable_hue_edit ? INT_MAX : 0, disable_hue_edit ? INT_MIN : hdr ? 0 : 255, fmt_table_int[fmt_idx][n]);
            }
            if (!(flags & ImGuiColorEditFlags_NoOptions))
                OpenPopupOnItemClick("context");
        }
    }
    else if ((flags & ImGuiColorEditFlags_DisplayHex) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB Hexadecimal Input
        char buf[64];
        if (alpha)
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", ImClamp(i[0],0,255), ImClamp(i[1],0,255), ImClamp(i[2],0,255), ImClamp(i[3],0,255));
        else
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", ImClamp(i[0],0,255), ImClamp(i[1],0,255), ImClamp(i[2],0,255));
        SetNextItemWidth(w_inputs);
        if (InputText("##Text", buf, IM_ARRAYSIZE(buf), ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase))
        {
            value_changed = true;
            char* p = buf;
            while (*p == '#' || ImCharIsBlankA(*p))
                p++;
            i[0] = i[1] = i[2] = i[3] = 0;
            if (alpha)
                sscanf(p, "%02X%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2], (unsigned int*)&i[3]); // Treat at unsigned (%X is unsigned)
            else
                sscanf(p, "%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2]);
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }

    ImGuiWindow* picker_active_window = NULL;
    if (!(flags & ImGuiColorEditFlags_NoSmallPreview))
    {
        const float button_offset_x = ((flags & ImGuiColorEditFlags_NoInputs) || (style.ColorButtonPosition == ImGuiDir_Left)) ? 0.0f : w_inputs + style.ItemInnerSpacing.x;
        window->DC.CursorPos = ImVec2(pos.x + button_offset_x, pos.y);

        const ImVec4 col_v4(col[0], col[1], col[2], alpha ? col[3] : 1.0f);
        if (ColorButton("##ColorButton", col_v4, flags))
        {
            if (!(flags & ImGuiColorEditFlags_NoPicker))
            {
                // Store current color and open a picker
                g.ColorPickerRef = col_v4;
                OpenPopup("picker");
                SetNextWindowPos(window->DC.LastItemRect.GetBL() + ImVec2(-1,style.ItemSpacing.y));
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        if (BeginPopup("picker"))
        {
            picker_active_window = g.CurrentWindow;
            if (label != label_display_end)
            {
                TextEx(label, label_display_end);
                Spacing();
            }
            ImGuiColorEditFlags picker_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__PickerMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaBar;
            ImGuiColorEditFlags picker_flags = (flags_untouched & picker_flags_to_forward) | ImGuiColorEditFlags__DisplayMask | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_AlphaPreviewHalf;
            SetNextItemWidth(square_sz * 12.0f); // Use 256 + bar sizes?
            value_changed |= ColorPicker4("##picker", col, picker_flags, &g.ColorPickerRef.x);
            EndPopup();
        }
    }

    if (label != label_display_end && !(flags & ImGuiColorEditFlags_NoLabel))
    {
        window->DC.CursorPos = ImVec2(pos.x + w_full + style.ItemInnerSpacing.x, pos.y + style.FramePadding.y);
        TextEx(label, label_display_end);
    }

    // Convert back
    if (value_changed && picker_active_window == NULL)
    {
        if (!value_changed_as_float)
            for (int n = 0; n < 4; n++)
                f[n] = i[n] / 255.0f;
        if ((flags & ImGuiColorEditFlags_DisplayHSV) && (flags & ImGuiColorEditFlags_InputRGB))
            ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
        if ((flags & ImGuiColorEditFlags_DisplayRGB) && (flags & ImGuiColorEditFlags_InputHSV))
            ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);

        col[0] = f[0];
        col[1] = f[1];
        col[2] = f[2];
        if (alpha)
            col[3] = f[3];
    }

    PopID();
    EndGroup();

    // Drag and Drop Target
    // NB: The flag test is merely an optional micro-optimization, BeginDragDropTarget() does the same test.
    if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropTarget())
    {
        bool accepted_drag_drop = false;
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * 3); // Preserve alpha if any //-V512
            value_changed = accepted_drag_drop = true;
        }
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * components);
            value_changed = accepted_drag_drop = true;
        }

        // Drag-drop payloads are always RGB
        if (accepted_drag_drop && (flags & ImGuiColorEditFlags_InputHSV))
            ColorConvertRGBtoHSV(col[0], col[1], col[2], col[0], col[1], col[2]);
        EndDragDropTarget();
    }

    // When picker is being actively used, use its active id so IsItemActive() will function on ColorEdit4().
    if (picker_active_window && g.ActiveId != 0 && g.ActiveIdWindow == picker_active_window)
        window->DC.LastItemId = g.ActiveId;

    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    return value_changed;
}